

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_get_html_translation_table(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pVal;
  jx9_value *pValue_00;
  uint local_3c;
  sxu32 n;
  jx9_value *pValue;
  jx9_value *pArray;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pVal = jx9_context_new_scalar(pCtx);
  if (pVal == (jx9_value *)0x0) {
    jx9_result_null(pCtx);
  }
  else {
    pValue_00 = jx9_context_new_array(pCtx);
    if (pValue_00 == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
    }
    else {
      for (local_3c = 0; local_3c < 0x28; local_3c = local_3c + 2) {
        jx9_value_string(pVal,azHtmlEscape[local_3c],-1);
        jx9_array_add_strkey_elem(pValue_00,azHtmlEscape[local_3c + 1],pVal);
        jx9_value_reset_string_cursor(pVal);
      }
      jx9_result_value(pCtx,pValue_00);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_get_html_translation_table(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	sxu32 n;
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make the table */
	for( n = 0 ; n < SX_ARRAYSIZE(azHtmlEscape) ; n += 2 ){
		/* Prepare the value */
		jx9_value_string(pValue, azHtmlEscape[n], -1 /* Compute length automatically */);
		/* Insert the value */
		jx9_array_add_strkey_elem(pArray, azHtmlEscape[n+1], pValue);
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically
	 * released upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}